

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrubberband.cpp
# Opt level: O1

void __thiscall QRubberBand::changeEvent(QRubberBand *this,QEvent *e)

{
  uint uVar1;
  QFlagsStorage<Qt::WindowType> flags;
  QEvent *pQVar2;
  
  pQVar2 = e;
  QWidget::changeEvent(&this->super_QWidget,e);
  flags.i = (Int)pQVar2;
  if (*(short *)(e + 8) == 0x15) {
    uVar1 = 0xd;
    if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) != 0) {
      uVar1 = 0;
    }
    flags.i = uVar1 | (((this->super_QWidget).data)->window_flags).
                      super_QFlagsStorageHelper<Qt::WindowType,_4>.
                      super_QFlagsStorage<Qt::WindowType>.i & 0xfffffff2;
    QWidget::setWindowFlags(&this->super_QWidget,(WindowFlags)flags.i);
  }
  if (*(short *)(e + 8) == 0x7e) {
    QWidget::raise(&this->super_QWidget,flags.i);
    return;
  }
  return;
}

Assistant:

void QRubberBand::changeEvent(QEvent *e)
{
    QWidget::changeEvent(e);
    switch (e->type()) {
    case QEvent::ParentChange:
        if (parent()) {
            setWindowFlags(windowFlags() & ~RUBBERBAND_WINDOW_TYPE);
        } else {
            setWindowFlags(windowFlags() | RUBBERBAND_WINDOW_TYPE);
        }
        break;
    default:
        break;
    }

    if (e->type() == QEvent::ZOrderChange)
        raise();
}